

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  MessageInfo *in_RDI;
  ReusableStringStream *in_stack_ffffffffffffff98;
  MessageInfo *pMVar2;
  MessageInfo *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  pMVar2 = in_RDI;
  MessageInfo::MessageInfo(in_stack_ffffffffffffffc0,in_RDI);
  *(undefined1 *)&pMVar2[1].macroName.m_start = 0;
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff98);
  std::__cxx11::string::operator=((string *)&in_RDI->message,local_30);
  std::__cxx11::string::~string(local_30);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[8])(pIVar1,in_RDI);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info ), m_moved()
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }